

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ostream * google::operator<<(ostream *os,PRIVATE_Counter *param_2)

{
  PRIVATE_Counter *this;
  int iVar1;
  LogStream *pLVar2;
  ostream *poVar3;
  bool bVar4;
  LogStream *local_60;
  LogMessage local_38;
  LogMessageVoidify local_21;
  LogStream *local_20;
  LogStream *log;
  PRIVATE_Counter *param_1_local;
  ostream *os_local;
  
  log = (LogStream *)param_2;
  param_1_local = (PRIVATE_Counter *)os;
  if (os == (ostream *)0x0) {
    local_60 = (LogStream *)0x0;
  }
  else {
    local_60 = (LogStream *)
               __dynamic_cast(os,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  }
  local_20 = local_60;
  bVar4 = false;
  if (local_60 != (LogStream *)0x0) {
    pLVar2 = LogMessage::LogStream::self(local_60);
    bVar4 = local_60 == pLVar2;
  }
  this = param_1_local;
  if (bVar4) {
    iVar1 = LogMessage::LogStream::ctr(local_20);
    std::ostream::operator<<(this,iVar1);
    return (ostream *)param_1_local;
  }
  LogMessageVoidify::LogMessageVoidify(&local_21);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc",
             0x67c);
  poVar3 = LogMessage::stream(&local_38);
  poVar3 = std::operator<<(poVar3,"Check failed: log && log == log->self() ");
  poVar3 = std::operator<<(poVar3,"You must not use COUNTER with non-glog ostream");
  LogMessageVoidify::operator&(&local_21,poVar3);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

ostream& operator<<(ostream &os, const PRIVATE_Counter&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream *log = static_cast<LogMessage::LogStream*>(&os);
#else
  LogMessage::LogStream *log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}